

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

bool __thiscall
duckdb_shell::ShellState::SetOutputFile(ShellState *this,char **azArg,idx_t nArg,char output_mode)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  bool bVar4;
  uint bTextMode;
  idx_t iVar5;
  char *pcVar6;
  char *__s1;
  char *pcVar7;
  bool bVar8;
  int local_54;
  
  if (safe_mode == '\x01') {
    SetOutputFile();
LAB_0020c6fd:
    bVar4 = false;
  }
  else {
    if (output_mode == 'e') {
      local_54 = 2;
      iVar2 = 0x78;
    }
    else if (output_mode == 'o') {
      local_54 = 2;
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      local_54 = 0;
    }
    if (nArg < 2) {
      pcVar6 = (char *)0x0;
      bVar4 = false;
    }
    else {
      iVar5 = 1;
      bVar4 = false;
      pcVar6 = (char *)0x0;
      do {
        pcVar7 = azArg[iVar5];
        if (*pcVar7 == '-') {
          __s1 = pcVar7;
          if (pcVar7[1] == '-') {
            __s1 = pcVar7 + 1;
          }
          iVar1 = strcmp(__s1,"-bom");
          if (iVar1 == 0) {
            bVar4 = true;
          }
          else {
            if (output_mode == 'e') {
LAB_0020c693:
              pFVar3 = (FILE *)this->out;
              pcVar6 = "ERROR: unknown option: \"%s\".  Usage:\n";
LAB_0020c6de:
              fprintf(pFVar3,pcVar6,pcVar7);
              showHelp(this->out,*azArg);
              return false;
            }
            if ((__s1[1] == 'x') && (__s1[2] == '\0')) {
              iVar2 = 0x78;
            }
            else if ((__s1[1] != 'e') || (iVar2 = 0x65, __s1[2] != '\0')) goto LAB_0020c693;
          }
        }
        else {
          bVar8 = pcVar6 != (char *)0x0;
          pcVar6 = pcVar7;
          if (bVar8) {
            pFVar3 = (FILE *)this->out;
            pcVar6 = "ERROR: extra parameter: \"%s\".  Usage:\n";
            goto LAB_0020c6de;
          }
        }
        iVar5 = iVar5 + 1;
      } while (nArg != iVar5);
    }
    bTextMode = 0;
    pcVar7 = "stdout";
    if (pcVar6 != (char *)0x0) {
      pcVar7 = pcVar6;
    }
    this->outCount = local_54;
    ResetOutput(this);
    if ((iVar2 == 0x78) || (iVar2 == 0x65)) {
      this->doXdgOpen = '\x01';
      this->modePrior = this->mode;
      this->priorShFlgs = this->shellFlgs;
      std::__cxx11::string::_M_assign((string *)&this->colSepPrior);
      std::__cxx11::string::_M_assign((string *)&this->rowSepPrior);
      if (iVar2 != 0x78) {
        NewTempFile(this,"txt");
      }
      else {
        NewTempFile(this,"csv");
        *(byte *)&this->shellFlgs = (byte)this->shellFlgs & 0xbf;
        this->mode = CSV;
        std::__cxx11::string::_M_replace
                  ((ulong)&this->colSeparator,0,(char *)(this->colSeparator)._M_string_length,
                   0x147bf02);
        std::__cxx11::string::_M_replace
                  ((ulong)&this->rowSeparator,0,(char *)(this->rowSeparator)._M_string_length,
                   0x134200e);
      }
      bTextMode = (uint)(iVar2 != 0x78);
      pcVar7 = this->zTempFile;
    }
    if (*pcVar7 == '|') {
      pFVar3 = popen(pcVar7 + 1,"w");
      this->out = (FILE *)pFVar3;
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stderr,"Error: cannot open pipe \"%s\"\n",pcVar7 + 1);
        this->out = _stdout;
        return false;
      }
    }
    else {
      pFVar3 = (FILE *)output_file_open(pcVar7,bTextMode);
      this->out = (FILE *)pFVar3;
      if (pFVar3 == (FILE *)0x0) {
        iVar2 = strcmp(pcVar7,"off");
        if (iVar2 != 0) {
          fprintf(_stderr,"Error: cannot write to \"%s\"\n",pcVar7);
        }
        this->out = _stdout;
        goto LAB_0020c6fd;
      }
    }
    if (bVar4) {
      fwrite(anon_var_dwarf_b26a,3,1,pFVar3);
    }
    pcVar6 = (char *)(this->outfile)._M_string_length;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&this->outfile,0,pcVar6,(ulong)pcVar7);
    stdout_is_console = false;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ShellState::SetOutputFile(const char **azArg, idx_t nArg, char output_mode) {
	if (safe_mode) {
		utf8_printf(stderr, ".output/.once/.excel cannot be used in -safe mode\n");
		return false;
	}
	const char *zFile = nullptr;
	int bTxtMode = 0;
	int eMode = 0;
	bool bBOM = false;
	int bOnce = 0; /* 0: .output, 1: .once, 2: .excel */

	if (output_mode == 'e') {
		// .excel
		eMode = 'x';
		bOnce = 2;
	} else if (output_mode == 'o') {
		// .once
		bOnce = 1;
	}
	for (idx_t i = 1; i < nArg; i++) {
		const char *z = azArg[i];
		if (z[0] == '-') {
			if (z[1] == '-') {
				z++;
			}
			if (strcmp(z, "-bom") == 0) {
				bBOM = true;
			} else if (output_mode != 'e' && strcmp(z, "-x") == 0) {
				eMode = 'x'; /* spreadsheet */
			} else if (output_mode != 'e' && strcmp(z, "-e") == 0) {
				eMode = 'e'; /* text editor */
			} else {
				utf8_printf(out, "ERROR: unknown option: \"%s\".  Usage:\n", azArg[i]);
				showHelp(out, azArg[0]);
				return false;
			}
		} else if (!zFile) {
			zFile = z;
		} else {
			utf8_printf(out, "ERROR: extra parameter: \"%s\".  Usage:\n", azArg[i]);
			showHelp(out, azArg[0]);
			return false;
		}
	}
	if (!zFile) {
		zFile = "stdout";
	}
	if (bOnce) {
		outCount = 2;
	} else {
		outCount = 0;
	}
	ResetOutput();
#ifndef SQLITE_NOHAVE_SYSTEM
	if (eMode == 'e' || eMode == 'x') {
		doXdgOpen = 1;
		PushOutputMode();
		if (eMode == 'x') {
			/* spreadsheet mode.  Output as CSV. */
			NewTempFile("csv");
			ShellClearFlag(SHFLG_Echo);
			mode = RenderMode::CSV;
			colSeparator = SEP_Comma;
			rowSeparator = SEP_CrLf;
		} else {
			/* text editor mode */
			NewTempFile("txt");
			bTxtMode = 1;
		}
		zFile = zTempFile;
	}
#endif /* SQLITE_NOHAVE_SYSTEM */
	if (zFile[0] == '|') {
#ifdef SQLITE_OMIT_POPEN
		raw_printf(stderr, "Error: pipes are not supported in this OS\n");
		out = stdout;
		return false;
#else
		out = popen(zFile + 1, "w");
		if (out == 0) {
			utf8_printf(stderr, "Error: cannot open pipe \"%s\"\n", zFile + 1);
			out = stdout;
			return false;
		} else {
			if (bBOM) {
				fprintf(out, "\357\273\277");
			}
			outfile = zFile;
		}
#endif
	} else {
		out = output_file_open(zFile, bTxtMode);
		if (!out) {
			if (strcmp(zFile, "off") != 0) {
				utf8_printf(stderr, "Error: cannot write to \"%s\"\n", zFile);
			}
			out = stdout;
			return false;
		} else {
			if (bBOM) {
				fprintf(out, "\357\273\277");
			}
			outfile = zFile;
		}
	}
	stdout_is_console = false;
	return true;
}